

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O2

S2LatLngRect * __thiscall
S2LatLngRect::PolarClosure(S2LatLngRect *__return_storage_ptr__,S2LatLngRect *this)

{
  double dVar1;
  VType VVar2;
  VType VVar3;
  VType VVar4;
  S1Interval SVar5;
  S1Interval local_20;
  
  dVar1 = (this->lat_).bounds_.c_[0];
  if (((dVar1 == -1.5707963267948966) && (!NAN(dVar1))) ||
     ((dVar1 = (this->lat_).bounds_.c_[1], dVar1 == 1.5707963267948966 && (!NAN(dVar1))))) {
    SVar5 = S1Interval::Full();
    local_20.bounds_.c_[0] = SVar5.bounds_.c_[0];
    local_20.bounds_.c_[1] = SVar5.bounds_.c_[1];
    S2LatLngRect(__return_storage_ptr__,&this->lat_,&local_20);
  }
  else {
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_00305080;
    VVar2 = (this->lat_).bounds_.c_[1];
    VVar3 = (this->lng_).bounds_.c_[0];
    VVar4 = (this->lng_).bounds_.c_[1];
    (__return_storage_ptr__->lat_).bounds_.c_[0] = (this->lat_).bounds_.c_[0];
    (__return_storage_ptr__->lat_).bounds_.c_[1] = VVar2;
    (__return_storage_ptr__->lng_).bounds_.c_[0] = VVar3;
    (__return_storage_ptr__->lng_).bounds_.c_[1] = VVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

S2LatLngRect S2LatLngRect::PolarClosure() const {
  if (lat_.lo() == -M_PI_2 || lat_.hi() == M_PI_2) {
    return S2LatLngRect(lat_, S1Interval::Full());
  }
  return *this;
}